

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O3

int fd_hevc_uninit_context(HEVCContext *ctx)

{
  HEVCParamSets *pHVar1;
  HEVCVPS *pHVar2;
  HEVCSPS *pHVar3;
  HEVCPPS *pHVar4;
  int i;
  long lVar5;
  
  if (ctx->ps != (HEVCParamSets *)0x0) {
    lVar5 = 0;
    do {
      pHVar1 = ctx->ps;
      pHVar2 = pHVar1->vps_list[lVar5];
      if (pHVar2 != (HEVCVPS *)0x0) {
        free((void *)((long)pHVar2 - (long)*(char *)((long)&pHVar2[-1].vps_num_hrd_parameters + 3)))
        ;
        pHVar1->vps_list[lVar5] = (HEVCVPS *)0x0;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
    lVar5 = 0;
    do {
      pHVar1 = ctx->ps;
      pHVar3 = pHVar1->sps_list[lVar5];
      if (pHVar3 != (HEVCSPS *)0x0) {
        free((void *)((long)pHVar3 - (long)(char)*(undefined1 *)((long)&pHVar3[-1].qp_bd_offset + 3)
                     ));
        pHVar1->sps_list[lVar5] = (HEVCSPS *)0x0;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x20);
    lVar5 = 0;
    do {
      pHVar1 = ctx->ps;
      pHVar4 = pHVar1->pps_list[lVar5];
      if (pHVar4 != (HEVCPPS *)0x0) {
        free((void *)((long)pHVar4 - (long)(char)pHVar4[-1].field_0x16cf));
        pHVar1->pps_list[lVar5] = (HEVCPPS *)0x0;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
    pHVar1 = ctx->ps;
    if (pHVar1 != (HEVCParamSets *)0x0) {
      free((void *)((long)pHVar1 - (long)*(char *)((long)&pHVar1[-1].pps + 7)));
      ctx->ps = (HEVCParamSets *)0x0;
    }
  }
  free((void *)((long)ctx - (long)*(char *)((long)&ctx[-1].min_mastering_luminance + 3)));
  return 0;
}

Assistant:

int fd_hevc_uninit_context(HEVCContext *ctx)
{
    if(ctx->ps)
    {
        for(int i = 0; i < 16; i++)
            fd_freep((void **)&ctx->ps->vps_list[i]);
        for(int i = 0; i < 32; i++)
            fd_freep((void **)&ctx->ps->sps_list[i]);
        for(int i = 0; i < 256; i++)
            fd_freep((void **)&ctx->ps->pps_list[i]);
        fd_freep((void **)&ctx->ps);
    }
    fd_free(ctx);
    return 0;
}